

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O0

void __thiscall
ctemplate::TemplateToken::UpdateModifier
          (TemplateToken *this,
          vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
          *auto_modvals)

{
  char *pcVar1;
  ulong uVar2;
  const_iterator modvals;
  bool bVar3;
  size_t __n;
  size_type sVar4;
  pointer pMVar5;
  reference ppMVar6;
  ostream *poVar7;
  _anonymous_namespace_ local_140 [39];
  allocator local_119;
  string local_118 [32];
  ctemplate local_f8 [39];
  allocator local_d1;
  string local_d0 [48];
  __normal_iterator<const_ctemplate::ModifierAndValue_*const_*,_std::vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>_>
  local_a0;
  __normal_iterator<const_ctemplate::ModifierAndValue_*const_*,_std::vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>_>
  local_98;
  __normal_iterator<const_ctemplate::ModifierAndValue_*const_*,_std::vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>_>
  local_90;
  const_iterator it_3;
  string before;
  __normal_iterator<ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
  local_68;
  __normal_iterator<ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
  local_60;
  __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
  local_58;
  const_iterator it_2;
  bool do_log;
  size_t longest_match;
  __normal_iterator<ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
  local_38;
  __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
  local_30;
  const_iterator it_1;
  __normal_iterator<const_ctemplate::ModifierAndValue_*const_*,_std::vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>_>
  local_20;
  const_iterator it;
  vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
  *auto_modvals_local;
  TemplateToken *this_local;
  
  it._M_current = (ModifierAndValue **)auto_modvals;
  bVar3 = std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::
          empty(&this->modvals);
  if (bVar3) {
    local_20._M_current =
         (ModifierAndValue **)
         std::
         vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
         ::begin(it._M_current);
    while( true ) {
      it_1._M_current =
           (ModifierAndValue *)
           std::
           vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
           ::end((vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                  *)it._M_current);
      bVar3 = __gnu_cxx::operator!=
                        (&local_20,
                         (__normal_iterator<const_ctemplate::ModifierAndValue_*const_*,_std::vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>_>
                          *)&it_1);
      if (!bVar3) break;
      ppMVar6 = __gnu_cxx::
                __normal_iterator<const_ctemplate::ModifierAndValue_*const_*,_std::vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>_>
                ::operator*(&local_20);
      std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::
      push_back(&this->modvals,*ppMVar6);
      __gnu_cxx::
      __normal_iterator<const_ctemplate::ModifierAndValue_*const_*,_std::vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>_>
      ::operator++(&local_20);
    }
  }
  else {
    local_38._M_current =
         (ModifierAndValue *)
         std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::
         begin(&this->modvals);
    __gnu_cxx::
    __normal_iterator<ctemplate::ModifierAndValue_const*,std::vector<ctemplate::ModifierAndValue,std::allocator<ctemplate::ModifierAndValue>>>
    ::__normal_iterator<ctemplate::ModifierAndValue*>
              ((__normal_iterator<ctemplate::ModifierAndValue_const*,std::vector<ctemplate::ModifierAndValue,std::allocator<ctemplate::ModifierAndValue>>>
                *)&local_30,&local_38);
    while( true ) {
      longest_match =
           (size_t)std::
                   vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
                   ::end(&this->modvals);
      bVar3 = __gnu_cxx::operator!=
                        (&local_30,
                         (__normal_iterator<ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
                          *)&longest_match);
      if (!bVar3) break;
      pMVar5 = __gnu_cxx::
               __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
               ::operator->(&local_30);
      if (pMVar5->modifier_info->xss_class == XSS_SAFE) {
        return;
      }
      __gnu_cxx::
      __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
      ::operator++(&local_30);
    }
    __n = anon_unknown_14::FindLongestMatch
                    (&this->modvals,
                     (vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                      *)it._M_current);
    sVar4 = std::
            vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
            ::size((vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                    *)it._M_current);
    if (__n != sVar4) {
      sVar4 = std::
              vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
              ::size((vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                      *)it._M_current);
      if (sVar4 <= __n) {
        __assert_fail("longest_match >= 0 && longest_match < auto_modvals.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                      ,0x31d,
                      "void ctemplate::TemplateToken::UpdateModifier(const vector<const ModifierAndValue *> &)"
                     );
      }
      it_2._M_current._7_1_ = 0;
      local_60._M_current =
           (ModifierAndValue *)
           std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::
           begin(&this->modvals);
      __gnu_cxx::
      __normal_iterator<ctemplate::ModifierAndValue_const*,std::vector<ctemplate::ModifierAndValue,std::allocator<ctemplate::ModifierAndValue>>>
      ::__normal_iterator<ctemplate::ModifierAndValue*>
                ((__normal_iterator<ctemplate::ModifierAndValue_const*,std::vector<ctemplate::ModifierAndValue,std::allocator<ctemplate::ModifierAndValue>>>
                  *)&local_58,&local_60);
      while( true ) {
        local_68._M_current =
             (ModifierAndValue *)
             std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>
             ::end(&this->modvals);
        bVar3 = __gnu_cxx::operator!=(&local_58,&local_68);
        if (!bVar3) break;
        pMVar5 = __gnu_cxx::
                 __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
                 ::operator->(&local_58);
        if (pMVar5->modifier_info->xss_class == XSS_WEB_STANDARD) {
          it_2._M_current._7_1_ = 1;
          break;
        }
        __gnu_cxx::
        __normal_iterator<const_ctemplate::ModifierAndValue_*,_std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>_>
        ::operator++(&local_58);
      }
      (anonymous_namespace)::PrettyPrintTokenModifiers_abi_cxx11_
                ((_anonymous_namespace_ *)&it_3,&this->modvals);
      local_98._M_current =
           (ModifierAndValue **)
           std::
           vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
           ::begin(it._M_current);
      local_90 = __gnu_cxx::
                 __normal_iterator<const_ctemplate::ModifierAndValue_*const_*,_std::vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>_>
                 ::operator+(&local_98,__n);
      while( true ) {
        local_a0._M_current =
             (ModifierAndValue **)
             std::
             vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
             ::end(it._M_current);
        bVar3 = __gnu_cxx::operator!=(&local_90,&local_a0);
        if (!bVar3) break;
        ppMVar6 = __gnu_cxx::
                  __normal_iterator<const_ctemplate::ModifierAndValue_*const_*,_std::vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>_>
                  ::operator*(&local_90);
        std::vector<ctemplate::ModifierAndValue,_std::allocator<ctemplate::ModifierAndValue>_>::
        push_back(&this->modvals,*ppMVar6);
        __gnu_cxx::
        __normal_iterator<const_ctemplate::ModifierAndValue_*const_*,_std::vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>_>
        ::operator++(&local_90);
      }
      if ((it_2._M_current._7_1_ & 1) != 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"ERROR: ");
        poVar7 = std::operator<<(poVar7,"Token: ");
        pcVar1 = this->text;
        uVar2 = this->textlen;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_d0,pcVar1,uVar2,&local_d1);
        poVar7 = std::operator<<(poVar7,local_d0);
        poVar7 = std::operator<<(poVar7," has missing in-template modifiers. You gave ");
        poVar7 = std::operator<<(poVar7,(string *)&it_3);
        poVar7 = std::operator<<(poVar7," and we computed ");
        modvals = it;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_118,"",&local_119);
        PrettyPrintModifiers
                  (local_f8,(vector<const_ctemplate::ModifierAndValue_*,_std::allocator<const_ctemplate::ModifierAndValue_*>_>
                             *)modvals._M_current,(string *)local_118);
        poVar7 = std::operator<<(poVar7,(string *)local_f8);
        poVar7 = std::operator<<(poVar7,". We changed to ");
        (anonymous_namespace)::PrettyPrintTokenModifiers_abi_cxx11_(local_140,&this->modvals);
        poVar7 = std::operator<<(poVar7,(string *)local_140);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)local_140);
        std::__cxx11::string::~string((string *)local_f8);
        std::__cxx11::string::~string(local_118);
        std::allocator<char>::~allocator((allocator<char> *)&local_119);
        std::__cxx11::string::~string(local_d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      }
      std::__cxx11::string::~string((string *)&it_3);
    }
  }
  return;
}

Assistant:

void UpdateModifier(const vector<const ModifierAndValue*>& auto_modvals) {
    // Common case: no modifiers given in template. Assign our own. No warning.
    if (modvals.empty()) {
      for (vector<const ModifierAndValue*>::const_iterator it
               = auto_modvals.begin(); it != auto_modvals.end(); ++it) {
        modvals.push_back(**it);
      }
      return;
    }

    // Look for any XSS-Safe modifiers (added via AddXssSafeModifier or :none).
    // If one is found anywhere in the vector, consider the variable safe.
    for (vector<ModifierAndValue>::const_iterator it = modvals.begin();
         it != modvals.end(); ++it) {
      if (it->modifier_info->xss_class == XSS_SAFE)
        return;
    }

    size_t longest_match = FindLongestMatch(modvals, auto_modvals);
    if (longest_match == auto_modvals.size()) {
      return;             // We have a complete match, nothing to do.
    } else {              // Copy missing ones and issue warning.
      assert(longest_match >= 0 && longest_match < auto_modvals.size());
      // We only log if one or more of the in-template modifiers was
      // escaping-related which we infer from the XssClass. Currently,
      // all escaping modifiers are in XSS_WEB_STANDARD except for 'none'
      // but that one is handled above.
      bool do_log = false;
      for (vector<ModifierAndValue>::const_iterator it = modvals.begin();
           it != modvals.end(); ++it) {
        if (it->modifier_info->xss_class == XSS_WEB_STANDARD) {
          do_log = true;
          break;
        }
      }
      string before = PrettyPrintTokenModifiers(modvals);  // for logging
      for (vector<const ModifierAndValue*>::const_iterator it
               = auto_modvals.begin() + longest_match;
           it != auto_modvals.end(); ++it) {
        modvals.push_back(**it);
      }
      if (do_log)
        LOG(ERROR)
            << "Token: " << string(text, textlen)
            << " has missing in-template modifiers. You gave " << before
            << " and we computed " << PrettyPrintModifiers(auto_modvals, "")
            << ". We changed to " << PrettyPrintTokenModifiers(modvals) << endl;
    }
  }